

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersector1<8,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar31 [32];
  byte bVar32;
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  AABBNodeMB4D *node1;
  ulong uVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  ulong uVar45;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  float fVar46;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar51 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar65 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar66 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  float fVar84;
  undefined1 auVar83 [64];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [64];
  undefined1 auVar89 [16];
  undefined1 auVar90 [64];
  undefined1 auVar91 [16];
  undefined1 auVar92 [64];
  float fVar93;
  undefined1 auVar94 [16];
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar95 [64];
  undefined1 auVar99 [16];
  uint uVar101;
  uint uVar102;
  uint uVar103;
  undefined1 auVar100 [64];
  undefined1 auVar104 [16];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  float fVar107;
  float fVar113;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar111;
  float fVar112;
  undefined1 auVar110 [64];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  undefined8 local_14a8;
  undefined8 uStack_14a0;
  int local_148c;
  undefined1 local_1488 [16];
  RTCIntersectArguments *local_1470;
  long local_1468;
  RayQueryContext *local_1460;
  undefined1 local_1458 [16];
  undefined1 local_1448 [16];
  long local_1430;
  long local_1428;
  long local_1420;
  ulong local_1418;
  ulong *local_1410;
  uint local_1408;
  uint local_1404;
  uint local_1400;
  undefined4 local_13fc;
  undefined4 local_13f8;
  undefined4 local_13f4;
  uint local_13f0;
  uint local_13ec;
  uint local_13e8;
  RTCFilterFunctionNArguments local_13d8;
  undefined1 local_13a8 [16];
  undefined1 local_1398 [16];
  undefined1 local_1388 [16];
  undefined1 local_1378 [16];
  undefined1 local_1368 [16];
  undefined1 local_1348 [16];
  undefined1 local_1338 [16];
  undefined1 local_1328 [16];
  float local_1318 [4];
  undefined1 local_1308 [16];
  undefined1 local_12f8 [16];
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined1 local_12d8 [32];
  undefined1 local_12b8 [32];
  undefined1 local_1298 [32];
  undefined1 local_1278 [32];
  undefined1 local_1258 [32];
  undefined1 local_1238 [32];
  undefined1 local_1218 [32];
  undefined1 local_11f8 [32];
  ulong local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_11d8 != 8) {
    fVar46 = ray->tfar;
    auVar76 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar46) {
      local_1460 = context;
      aVar4 = (ray->dir).field_0;
      auVar55 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar47._8_4_ = 0x7fffffff;
      auVar47._0_8_ = 0x7fffffff7fffffff;
      auVar47._12_4_ = 0x7fffffff;
      auVar47 = vandps_avx((undefined1  [16])aVar4,auVar47);
      auVar85._8_4_ = 0x219392ef;
      auVar85._0_8_ = 0x219392ef219392ef;
      auVar85._12_4_ = 0x219392ef;
      auVar47 = vcmpps_avx(auVar47,auVar85,1);
      auVar47 = vblendvps_avx((undefined1  [16])aVar4,auVar85,auVar47);
      local_1410 = local_11d0;
      auVar85 = vrcpps_avx(auVar47);
      fVar52 = auVar85._0_4_;
      auVar77._0_4_ = fVar52 * auVar47._0_4_;
      fVar53 = auVar85._4_4_;
      auVar77._4_4_ = fVar53 * auVar47._4_4_;
      fVar54 = auVar85._8_4_;
      auVar77._8_4_ = fVar54 * auVar47._8_4_;
      fVar84 = auVar85._12_4_;
      auVar77._12_4_ = fVar84 * auVar47._12_4_;
      auVar86._8_4_ = 0x3f800000;
      auVar86._0_8_ = 0x3f8000003f800000;
      auVar86._12_4_ = 0x3f800000;
      auVar47 = vsubps_avx(auVar86,auVar77);
      uVar3 = *(undefined4 *)&(ray->org).field_0;
      local_11f8._4_4_ = uVar3;
      local_11f8._0_4_ = uVar3;
      local_11f8._8_4_ = uVar3;
      local_11f8._12_4_ = uVar3;
      local_11f8._16_4_ = uVar3;
      local_11f8._20_4_ = uVar3;
      local_11f8._24_4_ = uVar3;
      local_11f8._28_4_ = uVar3;
      auVar90 = ZEXT3264(local_11f8);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      local_1218._4_4_ = uVar3;
      local_1218._0_4_ = uVar3;
      local_1218._8_4_ = uVar3;
      local_1218._12_4_ = uVar3;
      local_1218._16_4_ = uVar3;
      local_1218._20_4_ = uVar3;
      local_1218._24_4_ = uVar3;
      local_1218._28_4_ = uVar3;
      auVar92 = ZEXT3264(local_1218);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      local_1238._4_4_ = uVar3;
      local_1238._0_4_ = uVar3;
      local_1238._8_4_ = uVar3;
      local_1238._12_4_ = uVar3;
      local_1238._16_4_ = uVar3;
      local_1238._20_4_ = uVar3;
      local_1238._24_4_ = uVar3;
      local_1238._28_4_ = uVar3;
      auVar95 = ZEXT3264(local_1238);
      auVar78._0_4_ = fVar52 + fVar52 * auVar47._0_4_;
      auVar78._4_4_ = fVar53 + fVar53 * auVar47._4_4_;
      auVar78._8_4_ = fVar54 + fVar54 * auVar47._8_4_;
      auVar78._12_4_ = fVar84 + fVar84 * auVar47._12_4_;
      auVar47 = vshufps_avx(auVar78,auVar78,0);
      local_1258._16_16_ = auVar47;
      local_1258._0_16_ = auVar47;
      auVar100 = ZEXT3264(local_1258);
      auVar47 = vmovshdup_avx(auVar78);
      auVar83 = ZEXT1664(auVar47);
      auVar85 = vshufps_avx(auVar78,auVar78,0x55);
      local_1278._16_16_ = auVar85;
      local_1278._0_16_ = auVar85;
      auVar105 = ZEXT3264(local_1278);
      auVar85 = vshufpd_avx(auVar78,auVar78,1);
      auVar77 = vshufps_avx(auVar78,auVar78,0xaa);
      auVar81 = ZEXT1664(auVar77);
      local_1298._16_16_ = auVar77;
      local_1298._0_16_ = auVar77;
      auVar106 = ZEXT3264(local_1298);
      local_1418 = (ulong)(auVar78._0_4_ < 0.0) << 5;
      uVar43 = (ulong)(auVar47._0_4_ < 0.0) << 5 | 0x40;
      uVar41 = (ulong)(auVar85._0_4_ < 0.0) << 5 | 0x80;
      uVar44 = local_1418 ^ 0x20;
      auVar47 = vshufps_avx(auVar55,auVar55,0);
      auVar66 = ZEXT1664(auVar47);
      local_12b8._16_16_ = auVar47;
      local_12b8._0_16_ = auVar47;
      auVar88 = ZEXT3264(local_12b8);
      auVar47 = vshufps_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46),0);
      local_12d8._16_16_ = auVar47;
      local_12d8._0_16_ = auVar47;
      auVar110 = ZEXT3264(local_12d8);
      local_13a8 = mm_lookupmask_ps._240_16_;
LAB_002e6766:
      do {
        uVar45 = local_1410[-1];
        local_1410 = local_1410 + -1;
        while ((uVar45 & 8) == 0) {
          uVar38 = uVar45 & 0xfffffffffffffff0;
          fVar46 = (ray->dir).field_0.m128[3];
          auVar51._4_4_ = fVar46;
          auVar51._0_4_ = fVar46;
          auVar51._8_4_ = fVar46;
          auVar51._12_4_ = fVar46;
          auVar51._16_4_ = fVar46;
          auVar51._20_4_ = fVar46;
          auVar51._24_4_ = fVar46;
          auVar51._28_4_ = fVar46;
          pfVar2 = (float *)(uVar38 + 0x100 + local_1418);
          pfVar1 = (float *)(uVar38 + 0x40 + local_1418);
          auVar65._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar65._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar65._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar65._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar65._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar65._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar65._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar65._28_4_ = auVar66._28_4_ + pfVar1[7];
          auVar65 = vsubps_avx(auVar65,auVar90._0_32_);
          auVar31._4_4_ = auVar100._4_4_ * auVar65._4_4_;
          auVar31._0_4_ = auVar100._0_4_ * auVar65._0_4_;
          auVar31._8_4_ = auVar100._8_4_ * auVar65._8_4_;
          auVar31._12_4_ = auVar100._12_4_ * auVar65._12_4_;
          auVar31._16_4_ = auVar100._16_4_ * auVar65._16_4_;
          auVar31._20_4_ = auVar100._20_4_ * auVar65._20_4_;
          auVar31._24_4_ = auVar100._24_4_ * auVar65._24_4_;
          auVar31._28_4_ = auVar65._28_4_;
          auVar65 = vmaxps_avx(auVar88._0_32_,auVar31);
          pfVar2 = (float *)(uVar38 + 0x100 + uVar43);
          pfVar1 = (float *)(uVar38 + 0x40 + uVar43);
          auVar74._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar74._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar74._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar74._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar74._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar74._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar74._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar74._28_4_ = auVar76._28_4_ + pfVar1[7];
          auVar31 = vsubps_avx(auVar74,auVar92._0_32_);
          auVar33._4_4_ = auVar105._4_4_ * auVar31._4_4_;
          auVar33._0_4_ = auVar105._0_4_ * auVar31._0_4_;
          auVar33._8_4_ = auVar105._8_4_ * auVar31._8_4_;
          auVar33._12_4_ = auVar105._12_4_ * auVar31._12_4_;
          auVar33._16_4_ = auVar105._16_4_ * auVar31._16_4_;
          auVar33._20_4_ = auVar105._20_4_ * auVar31._20_4_;
          auVar33._24_4_ = auVar105._24_4_ * auVar31._24_4_;
          auVar33._28_4_ = auVar31._28_4_;
          pfVar2 = (float *)(uVar38 + 0x100 + uVar41);
          pfVar1 = (float *)(uVar38 + 0x40 + uVar41);
          auVar79._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar79._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar79._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar79._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar79._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar79._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar79._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar79._28_4_ = auVar81._28_4_ + pfVar1[7];
          auVar74 = vsubps_avx(auVar79,auVar95._0_32_);
          auVar34._4_4_ = auVar106._4_4_ * auVar74._4_4_;
          auVar34._0_4_ = auVar106._0_4_ * auVar74._0_4_;
          auVar34._8_4_ = auVar106._8_4_ * auVar74._8_4_;
          auVar34._12_4_ = auVar106._12_4_ * auVar74._12_4_;
          auVar34._16_4_ = auVar106._16_4_ * auVar74._16_4_;
          auVar34._20_4_ = auVar106._20_4_ * auVar74._20_4_;
          auVar34._24_4_ = auVar106._24_4_ * auVar74._24_4_;
          auVar34._28_4_ = auVar74._28_4_;
          auVar31 = vmaxps_avx(auVar33,auVar34);
          auVar65 = vmaxps_avx(auVar65,auVar31);
          pfVar2 = (float *)(uVar38 + 0x100 + uVar44);
          pfVar1 = (float *)(uVar38 + 0x40 + uVar44);
          auVar75._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar75._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar75._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar75._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar75._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar75._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar75._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar75._28_4_ = auVar31._28_4_ + pfVar1[7];
          auVar31 = vsubps_avx(auVar75,auVar90._0_32_);
          auVar35._4_4_ = auVar100._4_4_ * auVar31._4_4_;
          auVar35._0_4_ = auVar100._0_4_ * auVar31._0_4_;
          auVar35._8_4_ = auVar100._8_4_ * auVar31._8_4_;
          auVar35._12_4_ = auVar100._12_4_ * auVar31._12_4_;
          auVar35._16_4_ = auVar100._16_4_ * auVar31._16_4_;
          auVar35._20_4_ = auVar100._20_4_ * auVar31._20_4_;
          auVar35._24_4_ = auVar100._24_4_ * auVar31._24_4_;
          auVar35._28_4_ = auVar31._28_4_;
          pfVar2 = (float *)(uVar38 + 0x100 + (uVar43 ^ 0x20));
          auVar31 = vminps_avx(auVar110._0_32_,auVar35);
          pfVar1 = (float *)(uVar38 + 0x40 + (uVar43 ^ 0x20));
          auVar80._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar80._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar80._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar80._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar80._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar80._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar80._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar80._28_4_ = auVar74._28_4_ + pfVar1[7];
          auVar74 = vsubps_avx(auVar80,auVar92._0_32_);
          pfVar2 = (float *)(uVar38 + 0x100 + (uVar41 ^ 0x20));
          pfVar1 = (float *)(uVar38 + 0x40 + (uVar41 ^ 0x20));
          auVar82._0_4_ = fVar46 * *pfVar2 + *pfVar1;
          auVar82._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
          auVar82._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
          auVar82._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
          auVar82._16_4_ = fVar46 * pfVar2[4] + pfVar1[4];
          auVar82._20_4_ = fVar46 * pfVar2[5] + pfVar1[5];
          auVar82._24_4_ = fVar46 * pfVar2[6] + pfVar1[6];
          auVar82._28_4_ = auVar83._28_4_ + pfVar1[7];
          auVar36._4_4_ = auVar105._4_4_ * auVar74._4_4_;
          auVar36._0_4_ = auVar105._0_4_ * auVar74._0_4_;
          auVar36._8_4_ = auVar105._8_4_ * auVar74._8_4_;
          auVar36._12_4_ = auVar105._12_4_ * auVar74._12_4_;
          auVar36._16_4_ = auVar105._16_4_ * auVar74._16_4_;
          auVar36._20_4_ = auVar105._20_4_ * auVar74._20_4_;
          auVar36._24_4_ = auVar105._24_4_ * auVar74._24_4_;
          auVar36._28_4_ = auVar74._28_4_;
          auVar74 = vsubps_avx(auVar82,auVar95._0_32_);
          auVar37._4_4_ = auVar106._4_4_ * auVar74._4_4_;
          auVar37._0_4_ = auVar106._0_4_ * auVar74._0_4_;
          auVar37._8_4_ = auVar106._8_4_ * auVar74._8_4_;
          auVar37._12_4_ = auVar106._12_4_ * auVar74._12_4_;
          auVar37._16_4_ = auVar106._16_4_ * auVar74._16_4_;
          auVar37._20_4_ = auVar106._20_4_ * auVar74._20_4_;
          auVar37._24_4_ = auVar106._24_4_ * auVar74._24_4_;
          auVar37._28_4_ = auVar74._28_4_;
          auVar83 = ZEXT3264(auVar37);
          auVar74 = vminps_avx(auVar36,auVar37);
          auVar81 = ZEXT3264(auVar74);
          auVar31 = vminps_avx(auVar31,auVar74);
          auVar65 = vcmpps_avx(auVar65,auVar31,2);
          auVar66 = ZEXT3264(auVar65);
          if (((uint)uVar45 & 7) == 6) {
            auVar31 = vcmpps_avx(*(undefined1 (*) [32])(uVar38 + 0x1c0),auVar51,2);
            auVar74 = vcmpps_avx(auVar51,*(undefined1 (*) [32])(uVar38 + 0x1e0),1);
            auVar74 = vandps_avx(auVar31,auVar74);
            auVar65 = vandps_avx(auVar74,auVar65);
            auVar66 = ZEXT1664(auVar65._16_16_);
            auVar47 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
          }
          else {
            auVar47 = vpackssdw_avx(auVar65._0_16_,auVar65._16_16_);
          }
          auVar76 = ZEXT3264(auVar31);
          auVar47 = vpsllw_avx(auVar47,0xf);
          if ((((((((auVar47 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar47 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar47 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar47 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar47 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar47 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar47 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar47[0xf]) {
            if (local_1410 == &local_11d8) {
              return;
            }
            goto LAB_002e6766;
          }
          auVar47 = vpacksswb_avx(auVar47,auVar47);
          bVar32 = SUB161(auVar47 >> 7,0) & 1 | (SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar47 >> 0x17,0) & 1) << 2 | (SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar47 >> 0x27,0) & 1) << 4 | (SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar47 >> 0x37,0) & 1) << 6 | SUB161(auVar47 >> 0x3f,0) << 7;
          lVar40 = 0;
          if (bVar32 != 0) {
            for (; (bVar32 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
            }
          }
          uVar45 = *(ulong *)(uVar38 + lVar40 * 8);
          uVar42 = bVar32 - 1 & (uint)bVar32;
          if (uVar42 != 0) {
            *local_1410 = uVar45;
            local_1410 = local_1410 + 1;
            lVar40 = 0;
            if (uVar42 != 0) {
              for (; (uVar42 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
              }
            }
            uVar45 = *(ulong *)(uVar38 + lVar40 * 8);
            uVar42 = uVar42 - 1 & uVar42;
            uVar39 = (ulong)uVar42;
            if (uVar42 != 0) {
              do {
                *local_1410 = uVar45;
                local_1410 = local_1410 + 1;
                lVar40 = 0;
                if (uVar39 != 0) {
                  for (; (uVar39 >> lVar40 & 1) == 0; lVar40 = lVar40 + 1) {
                  }
                }
                uVar45 = *(ulong *)(uVar38 + lVar40 * 8);
                uVar39 = uVar39 & uVar39 - 1;
              } while (uVar39 != 0);
            }
          }
        }
        local_1420 = (ulong)((uint)uVar45 & 0xf) - 8;
        if (local_1420 != 0) {
          uVar45 = uVar45 & 0xfffffffffffffff0;
          local_1428 = 0;
          do {
            lVar40 = local_1428 * 0x140;
            fVar46 = (ray->dir).field_0.m128[3];
            pfVar2 = (float *)(uVar45 + 0x90 + lVar40);
            pfVar1 = (float *)(uVar45 + lVar40);
            auVar87._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar87._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar87._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar87._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xa0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x10 + lVar40);
            auVar89._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar89._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar89._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar89._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xb0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x20 + lVar40);
            auVar91._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar91._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar91._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar91._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xc0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x30 + lVar40);
            auVar55._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar55._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar55._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar55._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xd0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x40 + lVar40);
            auVar67._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar67._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar67._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar67._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xe0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x50 + lVar40);
            auVar94._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar94._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar94._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar94._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0xf0 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x60 + lVar40);
            auVar99._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar99._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar99._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar99._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar45 + 0x100 + lVar40);
            pfVar1 = (float *)(uVar45 + 0x70 + lVar40);
            auVar104._0_4_ = fVar46 * *pfVar2 + *pfVar1;
            auVar104._4_4_ = fVar46 * pfVar2[1] + pfVar1[1];
            auVar104._8_4_ = fVar46 * pfVar2[2] + pfVar1[2];
            auVar104._12_4_ = fVar46 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar45 + 0x110 + lVar40);
            pfVar2 = (float *)(uVar45 + 0x80 + lVar40);
            auVar48._0_4_ = fVar46 * *pfVar1 + *pfVar2;
            auVar48._4_4_ = fVar46 * pfVar1[1] + pfVar2[1];
            auVar48._8_4_ = fVar46 * pfVar1[2] + pfVar2[2];
            auVar48._12_4_ = fVar46 * pfVar1[3] + pfVar2[3];
            local_1448 = vsubps_avx(auVar87,auVar55);
            local_1488 = vsubps_avx(auVar89,auVar67);
            auVar47 = vsubps_avx(auVar91,auVar94);
            auVar55 = vsubps_avx(auVar99,auVar87);
            auVar85 = vsubps_avx(auVar104,auVar89);
            auVar77 = vsubps_avx(auVar48,auVar91);
            fVar54 = auVar77._0_4_;
            fVar107 = local_1488._0_4_;
            auVar49._0_4_ = fVar107 * fVar54;
            fVar10 = auVar77._4_4_;
            fVar111 = local_1488._4_4_;
            auVar49._4_4_ = fVar111 * fVar10;
            fVar17 = auVar77._8_4_;
            fVar112 = local_1488._8_4_;
            auVar49._8_4_ = fVar112 * fVar17;
            fVar24 = auVar77._12_4_;
            fVar113 = local_1488._12_4_;
            auVar49._12_4_ = fVar113 * fVar24;
            fVar84 = auVar85._0_4_;
            fVar93 = auVar47._0_4_;
            auVar56._0_4_ = fVar93 * fVar84;
            fVar11 = auVar85._4_4_;
            fVar96 = auVar47._4_4_;
            auVar56._4_4_ = fVar96 * fVar11;
            fVar18 = auVar85._8_4_;
            fVar97 = auVar47._8_4_;
            auVar56._8_4_ = fVar97 * fVar18;
            fVar25 = auVar85._12_4_;
            fVar98 = auVar47._12_4_;
            auVar56._12_4_ = fVar98 * fVar25;
            local_1458 = vsubps_avx(auVar56,auVar49);
            fVar5 = auVar55._0_4_;
            auVar57._0_4_ = fVar93 * fVar5;
            fVar12 = auVar55._4_4_;
            auVar57._4_4_ = fVar96 * fVar12;
            fVar19 = auVar55._8_4_;
            auVar57._8_4_ = fVar97 * fVar19;
            fVar26 = auVar55._12_4_;
            auVar57._12_4_ = fVar98 * fVar26;
            fVar6 = local_1448._0_4_;
            auVar68._0_4_ = fVar54 * fVar6;
            fVar13 = local_1448._4_4_;
            auVar68._4_4_ = fVar10 * fVar13;
            fVar20 = local_1448._8_4_;
            auVar68._8_4_ = fVar17 * fVar20;
            fVar27 = local_1448._12_4_;
            auVar68._12_4_ = fVar24 * fVar27;
            local_12f8 = vsubps_avx(auVar68,auVar57);
            auVar69._0_4_ = fVar84 * fVar6;
            auVar69._4_4_ = fVar11 * fVar13;
            auVar69._8_4_ = fVar18 * fVar20;
            auVar69._12_4_ = fVar25 * fVar27;
            auVar108._0_4_ = fVar107 * fVar5;
            auVar108._4_4_ = fVar111 * fVar12;
            auVar108._8_4_ = fVar112 * fVar19;
            auVar108._12_4_ = fVar113 * fVar26;
            auVar85 = vsubps_avx(auVar108,auVar69);
            uVar3 = *(undefined4 *)&(ray->org).field_0;
            auVar109._4_4_ = uVar3;
            auVar109._0_4_ = uVar3;
            auVar109._8_4_ = uVar3;
            auVar109._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar114._4_4_ = uVar3;
            auVar114._0_4_ = uVar3;
            auVar114._8_4_ = uVar3;
            auVar114._12_4_ = uVar3;
            uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar116._4_4_ = uVar3;
            auVar116._0_4_ = uVar3;
            auVar116._8_4_ = uVar3;
            auVar116._12_4_ = uVar3;
            fVar46 = (ray->dir).field_0.m128[1];
            auVar47 = vsubps_avx(auVar87,auVar109);
            fVar52 = (ray->dir).field_0.m128[2];
            auVar55 = vsubps_avx(auVar89,auVar114);
            auVar77 = vsubps_avx(auVar91,auVar116);
            fVar7 = auVar77._0_4_;
            auVar115._0_4_ = fVar46 * fVar7;
            fVar14 = auVar77._4_4_;
            auVar115._4_4_ = fVar46 * fVar14;
            fVar21 = auVar77._8_4_;
            auVar115._8_4_ = fVar46 * fVar21;
            fVar28 = auVar77._12_4_;
            auVar115._12_4_ = fVar46 * fVar28;
            fVar8 = auVar55._0_4_;
            auVar117._0_4_ = fVar52 * fVar8;
            fVar15 = auVar55._4_4_;
            auVar117._4_4_ = fVar52 * fVar15;
            fVar22 = auVar55._8_4_;
            auVar117._8_4_ = fVar52 * fVar22;
            fVar29 = auVar55._12_4_;
            auVar117._12_4_ = fVar52 * fVar29;
            auVar55 = vsubps_avx(auVar117,auVar115);
            fVar53 = (ray->dir).field_0.m128[0];
            fVar9 = auVar47._0_4_;
            auVar50._0_4_ = fVar52 * fVar9;
            fVar16 = auVar47._4_4_;
            auVar50._4_4_ = fVar52 * fVar16;
            fVar23 = auVar47._8_4_;
            auVar50._8_4_ = fVar52 * fVar23;
            fVar30 = auVar47._12_4_;
            auVar50._12_4_ = fVar52 * fVar30;
            auVar58._0_4_ = fVar53 * fVar7;
            auVar58._4_4_ = fVar53 * fVar14;
            auVar58._8_4_ = fVar53 * fVar21;
            auVar58._12_4_ = fVar53 * fVar28;
            auVar77 = vsubps_avx(auVar58,auVar50);
            auVar59._0_4_ = fVar53 * fVar8;
            auVar59._4_4_ = fVar53 * fVar15;
            auVar59._8_4_ = fVar53 * fVar22;
            auVar59._12_4_ = fVar53 * fVar29;
            auVar70._0_4_ = fVar46 * fVar9;
            auVar70._4_4_ = fVar46 * fVar16;
            auVar70._8_4_ = fVar46 * fVar23;
            auVar70._12_4_ = fVar46 * fVar30;
            auVar78 = vsubps_avx(auVar70,auVar59);
            auVar71._0_4_ =
                 fVar53 * local_1458._0_4_ + fVar46 * local_12f8._0_4_ + fVar52 * auVar85._0_4_;
            auVar71._4_4_ =
                 fVar53 * local_1458._4_4_ + fVar46 * local_12f8._4_4_ + fVar52 * auVar85._4_4_;
            auVar71._8_4_ =
                 fVar53 * local_1458._8_4_ + fVar46 * local_12f8._8_4_ + fVar52 * auVar85._8_4_;
            auVar71._12_4_ =
                 fVar53 * local_1458._12_4_ + fVar46 * local_12f8._12_4_ + fVar52 * auVar85._12_4_;
            auVar76 = ZEXT1664(auVar71);
            auVar60._8_8_ = 0x8000000080000000;
            auVar60._0_8_ = 0x8000000080000000;
            auVar47 = vandps_avx(auVar71,auVar60);
            uVar42 = auVar47._0_4_;
            local_1398._0_4_ =
                 (float)(uVar42 ^ (uint)(fVar5 * auVar55._0_4_ +
                                        fVar84 * auVar77._0_4_ + fVar54 * auVar78._0_4_));
            uVar101 = auVar47._4_4_;
            local_1398._4_4_ =
                 (float)(uVar101 ^
                        (uint)(fVar12 * auVar55._4_4_ +
                              fVar11 * auVar77._4_4_ + fVar10 * auVar78._4_4_));
            uVar102 = auVar47._8_4_;
            local_1398._8_4_ =
                 (float)(uVar102 ^
                        (uint)(fVar19 * auVar55._8_4_ +
                              fVar18 * auVar77._8_4_ + fVar17 * auVar78._8_4_));
            uVar103 = auVar47._12_4_;
            local_1398._12_4_ =
                 (float)(uVar103 ^
                        (uint)(fVar26 * auVar55._12_4_ +
                              fVar25 * auVar77._12_4_ + fVar24 * auVar78._12_4_));
            auVar81 = ZEXT1664(local_1398);
            local_1388._0_4_ =
                 (float)(uVar42 ^ (uint)(auVar55._0_4_ * fVar6 +
                                        auVar77._0_4_ * fVar107 + fVar93 * auVar78._0_4_));
            local_1388._4_4_ =
                 (float)(uVar101 ^
                        (uint)(auVar55._4_4_ * fVar13 +
                              auVar77._4_4_ * fVar111 + fVar96 * auVar78._4_4_));
            local_1388._8_4_ =
                 (float)(uVar102 ^
                        (uint)(auVar55._8_4_ * fVar20 +
                              auVar77._8_4_ * fVar112 + fVar97 * auVar78._8_4_));
            local_1388._12_4_ =
                 (float)(uVar103 ^
                        (uint)(auVar55._12_4_ * fVar27 +
                              auVar77._12_4_ * fVar113 + fVar98 * auVar78._12_4_));
            auVar83 = ZEXT1664(local_1388);
            auVar77 = ZEXT416(0) << 0x20;
            auVar47 = vcmpps_avx(local_1398,auVar77,5);
            auVar55 = vcmpps_avx(local_1388,auVar77,5);
            auVar47 = vandps_avx(auVar47,auVar55);
            auVar61._8_4_ = 0x7fffffff;
            auVar61._0_8_ = 0x7fffffff7fffffff;
            auVar61._12_4_ = 0x7fffffff;
            local_1368 = vandps_avx(auVar71,auVar61);
            auVar55 = vcmpps_avx(auVar77,auVar71,4);
            auVar47 = vandps_avx(auVar47,auVar55);
            auVar62._0_4_ = local_1398._0_4_ + local_1388._0_4_;
            auVar62._4_4_ = local_1398._4_4_ + local_1388._4_4_;
            auVar62._8_4_ = local_1398._8_4_ + local_1388._8_4_;
            auVar62._12_4_ = local_1398._12_4_ + local_1388._12_4_;
            auVar55 = vcmpps_avx(auVar62,local_1368,2);
            auVar66 = ZEXT1664(auVar55);
            auVar47 = vandps_avx(auVar47,auVar55);
            auVar55 = local_13a8 & auVar47;
            if ((((auVar55 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar55 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar55 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar55[0xf] < '\0') {
              auVar47 = vandps_avx(auVar47,local_13a8);
              local_1378._0_4_ =
                   (float)(uVar42 ^ (uint)(local_1458._0_4_ * fVar9 +
                                          local_12f8._0_4_ * fVar8 + fVar7 * auVar85._0_4_));
              local_1378._4_4_ =
                   (float)(uVar101 ^
                          (uint)(local_1458._4_4_ * fVar16 +
                                local_12f8._4_4_ * fVar15 + fVar14 * auVar85._4_4_));
              local_1378._8_4_ =
                   (float)(uVar102 ^
                          (uint)(local_1458._8_4_ * fVar23 +
                                local_12f8._8_4_ * fVar22 + fVar21 * auVar85._8_4_));
              local_1378._12_4_ =
                   (float)(uVar103 ^
                          (uint)(local_1458._12_4_ * fVar30 +
                                local_12f8._12_4_ * fVar29 + fVar28 * auVar85._12_4_));
              fVar46 = (ray->org).field_0.m128[3];
              fVar52 = local_1368._0_4_;
              auVar63._0_4_ = fVar52 * fVar46;
              fVar53 = local_1368._4_4_;
              auVar63._4_4_ = fVar53 * fVar46;
              fVar54 = local_1368._8_4_;
              auVar63._8_4_ = fVar54 * fVar46;
              fVar84 = local_1368._12_4_;
              auVar63._12_4_ = fVar84 * fVar46;
              auVar55 = vcmpps_avx(auVar63,local_1378,1);
              fVar46 = ray->tfar;
              auVar72._0_4_ = fVar52 * fVar46;
              auVar72._4_4_ = fVar53 * fVar46;
              auVar72._8_4_ = fVar54 * fVar46;
              auVar72._12_4_ = fVar84 * fVar46;
              auVar77 = vcmpps_avx(local_1378,auVar72,2);
              auVar76 = ZEXT1664(auVar77);
              auVar55 = vandps_avx(auVar77,auVar55);
              auVar66 = ZEXT1664(auVar55);
              local_1348 = vandps_avx(auVar55,auVar47);
              uVar42 = vmovmskps_avx(local_1348);
              if (uVar42 != 0) {
                local_1308 = local_1458;
                local_14a8 = auVar85._0_8_;
                uStack_14a0 = auVar85._8_8_;
                local_12e8 = local_14a8;
                uStack_12e0 = uStack_14a0;
                local_1448._0_8_ = local_1460->scene;
                auVar47 = vrcpps_avx(local_1368);
                fVar46 = auVar47._0_4_;
                auVar64._0_4_ = fVar52 * fVar46;
                fVar52 = auVar47._4_4_;
                auVar64._4_4_ = fVar53 * fVar52;
                fVar53 = auVar47._8_4_;
                auVar64._8_4_ = fVar54 * fVar53;
                fVar54 = auVar47._12_4_;
                auVar64._12_4_ = fVar84 * fVar54;
                auVar73._8_4_ = 0x3f800000;
                auVar73._0_8_ = 0x3f8000003f800000;
                auVar73._12_4_ = 0x3f800000;
                auVar76 = ZEXT1664(auVar73);
                auVar47 = vsubps_avx(auVar73,auVar64);
                fVar46 = fVar46 + fVar46 * auVar47._0_4_;
                fVar52 = fVar52 + fVar52 * auVar47._4_4_;
                fVar53 = fVar53 + fVar53 * auVar47._8_4_;
                fVar54 = fVar54 + fVar54 * auVar47._12_4_;
                local_1318[0] = fVar46 * local_1378._0_4_;
                local_1318[1] = fVar52 * local_1378._4_4_;
                local_1318[2] = fVar53 * local_1378._8_4_;
                local_1318[3] = fVar54 * local_1378._12_4_;
                local_1338._0_4_ = fVar46 * local_1398._0_4_;
                local_1338._4_4_ = fVar52 * local_1398._4_4_;
                local_1338._8_4_ = fVar53 * local_1398._8_4_;
                local_1338._12_4_ = fVar54 * local_1398._12_4_;
                auVar66 = ZEXT1664(local_1338);
                local_1328._0_4_ = fVar46 * local_1388._0_4_;
                local_1328._4_4_ = fVar52 * local_1388._4_4_;
                local_1328._8_4_ = fVar53 * local_1388._8_4_;
                local_1328._12_4_ = fVar54 * local_1388._12_4_;
                uVar38 = (ulong)(uVar42 & 0xff);
                local_1468 = lVar40 + uVar45;
                do {
                  local_1458._0_8_ = uVar38;
                  uVar39 = 0;
                  if (uVar38 != 0) {
                    for (; (uVar38 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
                    }
                  }
                  local_1488._0_8_ = uVar39;
                  local_13f0 = *(uint *)(local_1468 + 0x120 + uVar39 * 4);
                  local_1430 = *(long *)(*(long *)(local_1448._0_8_ + 0x1e8) + (ulong)local_13f0 * 8
                                        );
                  if ((*(uint *)(local_1430 + 0x34) & ray->mask) == 0) {
                    uVar38 = uVar38 ^ 1L << (uVar39 & 0x3f);
                  }
                  else {
                    if ((local_1460->args->filter == (RTCFilterFunctionN)0x0) &&
                       (*(long *)(local_1430 + 0x48) == 0)) goto LAB_002e6f0e;
                    local_1470 = local_1460->args;
                    local_13d8.context = local_1460->user;
                    local_1408 = *(uint *)(local_1308 + uVar39 * 4);
                    auVar47 = ZEXT416(local_1408);
                    local_1404 = *(uint *)(local_12f8 + uVar39 * 4);
                    auVar55 = ZEXT416(local_1404);
                    local_1400 = *(uint *)((long)&local_12e8 + uVar39 * 4);
                    auVar85 = ZEXT416(local_1400);
                    local_13fc = *(undefined4 *)(local_1338 + uVar39 * 4);
                    local_13f8 = *(undefined4 *)(local_1328 + uVar39 * 4);
                    local_13f4 = *(undefined4 *)(local_1468 + 0x130 + uVar39 * 4);
                    local_13ec = (local_13d8.context)->instID[0];
                    local_13e8 = (local_13d8.context)->instPrimID[0];
                    fVar46 = ray->tfar;
                    ray->tfar = local_1318[uVar39];
                    local_148c = -1;
                    local_13d8.valid = &local_148c;
                    local_13d8.geometryUserPtr = *(void **)(local_1430 + 0x18);
                    local_13d8.hit = (RTCHitN *)&local_1408;
                    local_13d8.N = 1;
                    local_13d8.ray = (RTCRayN *)ray;
                    if (*(code **)(local_1430 + 0x48) == (code *)0x0) {
LAB_002e6df5:
                      if ((local_1470->filter == (RTCFilterFunctionN)0x0) ||
                         (((local_1470->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          ((*(byte *)(local_1430 + 0x3e) & 0x40) == 0)))) {
LAB_002e6f0e:
                        ray->tfar = -INFINITY;
                        return;
                      }
                      auVar76 = ZEXT1664(auVar47);
                      auVar81 = ZEXT1664(auVar55);
                      auVar83 = ZEXT1664(auVar85);
                      (*local_1470->filter)(&local_13d8);
                      auVar66._8_56_ = extraout_var_00;
                      auVar66._0_8_ = extraout_XMM1_Qa_00;
                      if (*local_13d8.valid != 0) goto LAB_002e6f0e;
                    }
                    else {
                      auVar76 = ZEXT464(local_1408);
                      auVar81 = ZEXT464(local_1404);
                      auVar83 = ZEXT464(local_1400);
                      (**(code **)(local_1430 + 0x48))(&local_13d8);
                      auVar85 = auVar83._0_16_;
                      auVar55 = auVar81._0_16_;
                      auVar47 = auVar76._0_16_;
                      auVar66._8_56_ = extraout_var;
                      auVar66._0_8_ = extraout_XMM1_Qa;
                      if (*local_13d8.valid != 0) goto LAB_002e6df5;
                    }
                    ray->tfar = fVar46;
                    uVar38 = local_1458._0_8_ ^ 1L << (local_1488._0_8_ & 0x3f);
                  }
                } while (uVar38 != 0);
              }
            }
            local_1428 = local_1428 + 1;
          } while (local_1428 != local_1420);
        }
        auVar90 = ZEXT3264(local_11f8);
        auVar92 = ZEXT3264(local_1218);
        auVar95 = ZEXT3264(local_1238);
        auVar100 = ZEXT3264(local_1258);
        auVar105 = ZEXT3264(local_1278);
        auVar106 = ZEXT3264(local_1298);
        auVar88 = ZEXT3264(local_12b8);
        auVar110 = ZEXT3264(local_12d8);
      } while (local_1410 != &local_11d8);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }